

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

char * libssh2_session_methods(LIBSSH2_SESSION *session,int method_type)

{
  undefined8 *puVar1;
  long lVar2;
  char *pcVar3;
  int errcode;
  
  switch(method_type) {
  case 0:
    lVar2 = 0x90;
    break;
  case 1:
    lVar2 = 0xb8;
    break;
  case 2:
    lVar2 = 0x1b0;
    break;
  case 3:
    lVar2 = 0x140;
    break;
  case 4:
    lVar2 = 0x1c0;
    break;
  case 5:
    lVar2 = 0x150;
    break;
  case 6:
    lVar2 = 0x1d8;
    break;
  case 7:
    lVar2 = 0x168;
    break;
  case 8:
  case 9:
    return "";
  default:
    pcVar3 = "Invalid parameter specified for method_type";
    errcode = -0x22;
    goto LAB_00107cbf;
  }
  puVar1 = *(undefined8 **)((long)&session->abstract + lVar2);
  if (puVar1 == (undefined8 *)0x0) {
    pcVar3 = "No method negotiated";
    errcode = -0x11;
LAB_00107cbf:
    _libssh2_error(session,errcode,pcVar3);
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)*puVar1;
  }
  return pcVar3;
}

Assistant:

LIBSSH2_API const char *
libssh2_session_methods(LIBSSH2_SESSION * session, int method_type)
{
    /* All methods have char *name as their first element */
    const LIBSSH2_KEX_METHOD *method = NULL;

    switch(method_type) {
    case LIBSSH2_METHOD_KEX:
        method = session->kex;
        break;

    case LIBSSH2_METHOD_HOSTKEY:
        method = (const LIBSSH2_KEX_METHOD *) session->hostkey;
        break;

    case LIBSSH2_METHOD_CRYPT_CS:
        method = (const LIBSSH2_KEX_METHOD *) session->local.crypt;
        break;

    case LIBSSH2_METHOD_CRYPT_SC:
        method = (const LIBSSH2_KEX_METHOD *) session->remote.crypt;
        break;

    case LIBSSH2_METHOD_MAC_CS:
        method = (const LIBSSH2_KEX_METHOD *) session->local.mac;
        break;

    case LIBSSH2_METHOD_MAC_SC:
        method = (const LIBSSH2_KEX_METHOD *) session->remote.mac;
        break;

    case LIBSSH2_METHOD_COMP_CS:
        method = (const LIBSSH2_KEX_METHOD *) session->local.comp;
        break;

    case LIBSSH2_METHOD_COMP_SC:
        method = (const LIBSSH2_KEX_METHOD *) session->remote.comp;
        break;

    case LIBSSH2_METHOD_LANG_CS:
        return "";

    case LIBSSH2_METHOD_LANG_SC:
        return "";

    default:
        _libssh2_error(session, LIBSSH2_ERROR_INVAL,
                       "Invalid parameter specified for method_type");
        return NULL;
    }

    if(!method) {
        _libssh2_error(session, LIBSSH2_ERROR_METHOD_NONE,
                       "No method negotiated");
        return NULL;
    }

    return method->name;
}